

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldSat.c
# Opt level: O1

Vec_Vec_t * Saig_RefManOrderLiterals(Saig_RefMan_t *p,Vec_Int_t *vVar2PiId,Vec_Int_t *vAssumps)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Vec_Vec_t *p_00;
  void **ppvVar5;
  void *__s;
  ulong uVar6;
  long lVar7;
  
  p_00 = (Vec_Vec_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  ppvVar5 = (void **)malloc(800);
  p_00->pArray = ppvVar5;
  iVar1 = p->pAig->nTruePis;
  iVar3 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar3 = iVar1;
  }
  if (iVar3 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)iVar3 << 2);
  }
  if (__s != (void *)0x0) {
    memset(__s,0xff,(long)iVar1 * 4);
  }
  if (0 < vAssumps->nSize) {
    lVar7 = 0;
    do {
      iVar3 = vAssumps->pArray[lVar7];
      uVar4 = iVar3 >> 1;
      if (((int)uVar4 < 0) || (vVar2PiId->nSize <= (int)uVar4)) {
LAB_00610b53:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar4 = vVar2PiId->pArray[uVar4];
      if (((int)uVar4 < 0) || (p->pFrames->nObjs[2] <= (int)uVar4)) {
        __assert_fail("iPiNum >= 0 && iPiNum < Aig_ManCiNum(p->pFrames)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absOldSat.c"
                      ,0x1c1,
                      "Vec_Vec_t *Saig_RefManOrderLiterals(Saig_RefMan_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      iVar2 = p->vMapPiF2A->nSize;
      if ((iVar2 <= (int)(uVar4 * 2)) || (iVar2 <= (int)(uVar4 * 2 | 1))) goto LAB_00610b53;
      uVar4 = p->vMapPiF2A->pArray[(ulong)uVar4 * 2];
      uVar6 = (ulong)uVar4;
      if (((int)uVar4 < 0) || (iVar1 <= (int)uVar4)) goto LAB_00610b53;
      if (*(int *)((long)__s + uVar6 * 4) == -1) {
        *(int *)((long)__s + uVar6 * 4) = p_00->nSize;
      }
      Vec_VecPushInt(p_00,*(int *)((long)__s + uVar6 * 4),iVar3);
      lVar7 = lVar7 + 1;
    } while (lVar7 < vAssumps->nSize);
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  return p_00;
}

Assistant:

Vec_Vec_t * Saig_RefManOrderLiterals( Saig_RefMan_t * p, Vec_Int_t * vVar2PiId, Vec_Int_t * vAssumps )
{
    Vec_Vec_t * vLits;
    Vec_Int_t * vVar2New;
    int i, Entry, iInput, iFrame;
    // collect literals
    vLits = Vec_VecAlloc( 100 );
    vVar2New = Vec_IntStartFull( Saig_ManPiNum(p->pAig) );
    Vec_IntForEachEntry( vAssumps, Entry, i )
    {
        int iPiNum = Vec_IntEntry( vVar2PiId, lit_var(Entry) );
        assert( iPiNum >= 0 && iPiNum < Aig_ManCiNum(p->pFrames) );
        iInput = Vec_IntEntry( p->vMapPiF2A, 2*iPiNum );
        iFrame = Vec_IntEntry( p->vMapPiF2A, 2*iPiNum+1 );
//        Abc_InfoSetBit( pCare->pData, pCare->nRegs + pCare->nPis * iFrame + iInput );
        if ( Vec_IntEntry( vVar2New, iInput ) == ~0 )
            Vec_IntWriteEntry( vVar2New, iInput, Vec_VecSize(vLits) );
        Vec_VecPushInt( vLits, Vec_IntEntry( vVar2New, iInput ), Entry );
    }
    Vec_IntFree( vVar2New );
    return vLits;
}